

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.cc
# Opt level: O0

void __thiscall EmitPrettyPrint::flush(EmitPrettyPrint *this)

{
  bool bVar1;
  int4 iVar2;
  LowlevelError *this_00;
  allocator local_39;
  string local_38 [32];
  TokenSplit *local_18;
  TokenSplit *tok;
  EmitPrettyPrint *this_local;
  
  tok = (TokenSplit *)this;
  while( true ) {
    bVar1 = circularqueue<TokenSplit>::empty(&this->tokqueue);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this->needbreak = false;
      (*this->lowlevel->_vptr_EmitXml[0x26])();
      return;
    }
    local_18 = circularqueue<TokenSplit>::popbottom(&this->tokqueue);
    iVar2 = TokenSplit::getSize(local_18);
    if (iVar2 < 0) break;
    print(this,local_18);
  }
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"Cannot flush pretty printer. Missing group end",&local_39);
  LowlevelError::LowlevelError(this_00,(string *)local_38);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void EmitPrettyPrint::flush(void)

{
  while(!tokqueue.empty()) {
    TokenSplit &tok( tokqueue.popbottom() );
    if (tok.getSize() < 0)
      throw LowlevelError("Cannot flush pretty printer. Missing group end");
    print(tok);
  }
  needbreak = false;
#ifdef PRETTY_DEBUG
  if (!scanqueue.empty())
    throw LowlevelError("prettyprint scanqueue did not flush");
  if (!indentstack.empty())
    throw LowlevelError("prettyprint indentstack did not flush");
#endif
  lowlevel->flush();
}